

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lengauer_tarjan.cpp
# Opt level: O3

void __thiscall LengauerTarjan::find_doms(LengauerTarjan *this)

{
  vector<int,std::allocator<int>> *this_00;
  int iVar1;
  iterator __position;
  int *piVar2;
  bool bVar3;
  int iVar4;
  pointer piVar5;
  pointer piVar6;
  long lVar7;
  pointer piVar8;
  long lVar9;
  int *piVar10;
  long lVar11;
  int w;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  buckets;
  allocator_type local_59;
  value_type local_58;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_40;
  
  local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&local_40,
           ((long)(this->in).
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->in).
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,&local_58,
           &local_59);
  if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (0 < (long)this->count) {
    lVar9 = (long)this->count;
    do {
      piVar5 = (this->vertex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar4 = piVar5[lVar9];
      local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)CONCAT44(local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start._4_4_,iVar4);
      lVar7 = (long)iVar4;
      piVar10 = preds.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar7].
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start;
      if (piVar10 ==
          preds.
          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[lVar7].
          super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish) {
        piVar8 = (this->semi).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
      }
      else {
        do {
          lVar11 = (long)*piVar10;
          if ((this->ancestor).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar11] != -1) {
            COMPRESS(this,*piVar10);
            lVar11 = (long)(this->label).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar11];
            iVar4 = (int)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start;
          }
          piVar8 = (this->semi).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar7 = (long)iVar4;
          if (piVar8[lVar11] < piVar8[lVar7]) {
            piVar8[lVar7] = piVar8[lVar11];
            lVar7 = (long)(int)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start;
            iVar4 = (int)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start;
          }
          piVar10 = piVar10 + 1;
        } while (piVar10 !=
                 preds.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar7].
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_finish);
        piVar5 = (this->vertex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
      }
      this_00 = (vector<int,std::allocator<int>> *)
                (local_40.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + piVar5[piVar8[lVar7]]);
      __position._M_current = *(int **)(this_00 + 8);
      if (__position._M_current == *(int **)(this_00 + 0x10)) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  (this_00,__position,(int *)&local_58);
      }
      else {
        *__position._M_current = iVar4;
        *(int **)(this_00 + 8) = __position._M_current + 1;
      }
      piVar5 = (this->parent).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      (this->ancestor).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start[(int)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start] =
           piVar5[(int)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start];
      piVar10 = local_40.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start
                [piVar5[(int)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start]].
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start;
      if (piVar10 !=
          local_40.
          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start
          [piVar5[(int)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start]].
          super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish) {
        do {
          iVar4 = *piVar10;
          lVar11 = (long)iVar4;
          lVar7 = lVar11;
          if ((this->ancestor).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar11] != -1) {
            COMPRESS(this,iVar4);
            piVar5 = (this->parent).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            iVar4 = (this->label).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar11];
            lVar7 = (long)iVar4;
          }
          piVar8 = (this->semi).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if (piVar8[lVar11] <= piVar8[lVar7]) {
            iVar4 = piVar5[(int)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start];
          }
          (this->idom).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
          ._M_start[lVar11] = iVar4;
          piVar10 = piVar10 + 1;
        } while (piVar10 !=
                 local_40.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start
                 [piVar5[(int)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start]].
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_finish);
        piVar2 = local_40.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start
                 [piVar5[(int)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start]].
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start;
        if (piVar10 != piVar2) {
          local_40.
          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start
          [piVar5[(int)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start]].
          super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
               piVar2;
        }
      }
      bVar3 = 1 < lVar9;
      lVar9 = lVar9 + -1;
    } while (bVar3);
    iVar4 = this->count;
    if (0 < iVar4) {
      piVar5 = (this->vertex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar8 = (this->semi).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar6 = (this->idom).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar9 = 0;
      do {
        iVar1 = piVar5[lVar9 + 1];
        if (piVar6[iVar1] != piVar5[piVar8[iVar1]]) {
          piVar6[iVar1] = piVar6[piVar6[iVar1]];
          iVar4 = this->count;
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 < iVar4);
      goto LAB_001cfdd1;
    }
  }
  piVar6 = (this->idom).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
LAB_001cfdd1:
  piVar6[this->root] = this->root;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_40);
  return;
}

Assistant:

void LengauerTarjan::find_doms() {
	// for (int i = 0; i < preds.size(); i++) {
	//     cout <<"Preds of "<<i<<": ";
	//     for (int j = 0; j < preds[i].size(); j++) {
	//             cout <<preds[i][j]<<", ";
	//     }
	//     cout<<endl;
	// }
	// cout << "Semi ";
	// for (int i = 0; i < in.size(); i++)
	//     cout <<"("<<i <<","<< semi[i]<<") ";
	// cout<<endl;
	// cout << "vertex ";
	// for (int i = 0; i < in.size(); i++)
	//     cout <<"("<<i <<","<< vertex[i]<<") ";
	// cout<<endl;
	// cout << "label ";
	// for (int i = 0; i < in.size(); i++)
	//     cout <<"("<<i <<","<< label[i]<<") ";
	// cout<<endl;
	// cout << "parent ";
	// for (int i = 0; i < in.size(); i++)
	//     cout <<"("<<i <<","<< parent[i]<<") ";
	// cout<<endl;
	// cout <<"count "<<count<<endl;

	std::vector<std::vector<int> > buckets =
			std::vector<std::vector<int> >(in.size(), std::vector<int>());

	for (int i = count; i >= 1; i--) {
		const int w = vertex[i];
		std::vector<int>::iterator it;
		for (it = preds[w].begin(); it != preds[w].end(); it++) {
			const int v = *it;
			const int u = EVAL(v);
			if (semi[u] < semi[w]) {
				semi[w] = semi[u];
			}
		}
		buckets[vertex[semi[w]]].push_back(w);
		LINK(parent[w], w);
		for (it = buckets[parent[w]].begin(); it != buckets[parent[w]].end(); it++) {
			const int v = *it;
			const int u = EVAL(v);
			idom[v] = (semi[u] < semi[v]) ? u : parent[w];
		}
		buckets[parent[w]].clear();
	}

	for (int i = 1; i <= count; i++) {
		const int w = vertex[i];
		if (idom[w] != vertex[semi[w]]) {
			idom[w] = idom[idom[w]];
		}
	}
	idom[root] = root;

}